

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetReservoirQuantileAggregate(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  GetReservoirQuantileAggregateFunction(__return_storage_ptr__,type);
  __return_storage_ptr__->bind = BindReservoirQuantile;
  __return_storage_ptr__->serialize = ReservoirQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ReservoirQuantileBindData::Deserialize;
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &__return_storage_ptr__->field_0x48,(LogicalTypeId *)&LogicalType::DOUBLE);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetReservoirQuantileAggregate(PhysicalType type) {
	auto fun = GetReservoirQuantileAggregateFunction(type);
	fun.bind = BindReservoirQuantile;
	fun.serialize = ReservoirQuantileBindData::Serialize;
	fun.deserialize = ReservoirQuantileBindData::Deserialize;
	// temporarily push an argument so we can bind the actual quantile
	fun.arguments.emplace_back(LogicalType::DOUBLE);
	return fun;
}